

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall
GlobOpt::CaptureCopyPropValue
          (GlobOpt *this,BasicBlock *block,Sym *sym,Value *val,EditingIterator *bailOutCopySymsIter)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  bool bVar2;
  StackSym *param2;
  undefined4 *puVar3;
  
  if (sym->m_kind == SymKindStack) {
    param2 = GlobOptBlockData::GetCopyPropSym(&block->globOptData,sym,val);
    if (param2 != (StackSym *)0x0) {
      allocator = this->func->m_alloc;
      if (sym->m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
      EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                ((EditingIterator *)bailOutCopySymsIter,&allocator->super_ArenaAllocator,
                 (StackSym *)sym,param2);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::CaptureCopyPropValue(BasicBlock * block, Sym * sym, Value * val, SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter)
{
    if (!sym->IsStackSym())
    {
        return;
    }

    StackSym * copyPropSym = block->globOptData.GetCopyPropSym(sym, val);
    if (copyPropSym != nullptr)
    {
        bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, sym->AsStackSym(), copyPropSym);
    }
}